

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpf_common_sse2.h
# Opt level: O2

void highbd_transpose8x8_sse2
               (__m128i *x0,__m128i *x1,__m128i *x2,__m128i *x3,__m128i *x4,__m128i *x5,__m128i *x6,
               __m128i *x7,__m128i *d0,__m128i *d1,__m128i *d2,__m128i *d3,__m128i *d4,__m128i *d5,
               __m128i *d6,__m128i *d7)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  __m128i alVar7;
  
  highbd_transpose8x8_low_sse2(x0,x1,x2,x3,x4,x5,x6,x7,d0,d1,d2,d3);
  auVar1 = vpunpckhwd_avx((undefined1  [16])*x0,(undefined1  [16])*x1);
  auVar2 = vpunpckhwd_avx((undefined1  [16])*x2,(undefined1  [16])*x3);
  auVar3 = vpunpckhwd_avx((undefined1  [16])*x4,(undefined1  [16])*x5);
  auVar4 = vpunpckhwd_avx((undefined1  [16])*x6,(undefined1  [16])*x7);
  auVar5 = vpunpckldq_avx(auVar1,auVar2);
  auVar6 = vpunpckldq_avx(auVar3,auVar4);
  alVar7 = (__m128i)vpunpcklqdq_avx(auVar5,auVar6);
  *d4 = alVar7;
  alVar7 = (__m128i)vpunpckhqdq_avx(auVar5,auVar6);
  *d5 = alVar7;
  auVar1 = vpunpckhdq_avx(auVar1,auVar2);
  auVar2 = vpunpckhdq_avx(auVar3,auVar4);
  alVar7 = (__m128i)vpunpcklqdq_avx(auVar1,auVar2);
  *d6 = alVar7;
  alVar7 = (__m128i)vpunpckhqdq_avx(auVar1,auVar2);
  *d7 = alVar7;
  return;
}

Assistant:

static inline void highbd_transpose8x8_sse2(
    __m128i *x0, __m128i *x1, __m128i *x2, __m128i *x3, __m128i *x4,
    __m128i *x5, __m128i *x6, __m128i *x7, __m128i *d0, __m128i *d1,
    __m128i *d2, __m128i *d3, __m128i *d4, __m128i *d5, __m128i *d6,
    __m128i *d7) {
  highbd_transpose8x8_low_sse2(x0, x1, x2, x3, x4, x5, x6, x7, d0, d1, d2, d3);
  highbd_transpose8x8_high_sse2(x0, x1, x2, x3, x4, x5, x6, x7, d4, d5, d6, d7);
}